

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase29::run(TestCase29 *this)

{
  bool bVar1;
  char *in_RCX;
  char (*params) [4];
  char (*params_00) [4];
  char (*params_01) [4];
  char (*params_02) [4];
  char (*extraout_RDX) [4];
  char (*params_03) [4];
  char (*params_04) [4];
  char (*extraout_RDX_00) [4];
  char *params_2;
  char *pcVar2;
  longlong *in_stack_fffffffffffff8c8;
  undefined1 local_6d1 [25];
  undefined1 local_6b8 [87];
  undefined1 local_661 [31];
  bool local_642;
  undefined1 local_641 [7];
  bool _kj_shouldLog_6;
  undefined1 local_628 [87];
  undefined1 local_5d1 [25];
  DebugExpression<char_const(&)[12]> local_5b8 [8];
  undefined1 local_5b0 [8];
  DebugComparison<const_char_(&)[12],_kj::String> _kjCondition_6;
  uint local_570;
  undefined4 uStack_56c;
  bool _kj_shouldLog_5;
  undefined1 local_568 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition_5;
  uint local_534;
  undefined1 local_530 [4];
  uint pieceCount;
  undefined1 local_511;
  undefined1 local_510 [7];
  bool _kj_shouldLog_4;
  DebugExpression<char_const(&)[10]> local_4f8 [8];
  undefined1 local_4f0 [8];
  DebugComparison<const_char_(&)[10],_kj::String> _kjCondition_4;
  undefined1 local_4a0 [24];
  undefined1 local_488 [64];
  StringTree tree;
  StringTree local_410;
  String local_3d8;
  undefined1 local_3bc;
  undefined1 local_3bb [3];
  undefined1 local_3b8 [4];
  bool _kj_shouldLog_3;
  String local_380;
  DebugExpression<char_const(&)[4]> local_368 [8];
  undefined1 local_360 [8];
  DebugComparison<const_char_(&)[4],_kj::String> _kjCondition_3;
  char local_320 [12];
  undefined1 local_314 [60];
  String local_2d8;
  undefined1 local_2bd;
  char local_2bc [4];
  char acStack_2b8 [3];
  bool _kj_shouldLog_2;
  undefined1 local_2ac [60];
  String local_270;
  DebugExpression<char_const(&)[20]> local_258 [8];
  undefined1 local_250 [8];
  DebugComparison<const_char_(&)[20],_kj::String> _kjCondition_2;
  char local_210 [8];
  char local_208 [4];
  undefined1 local_204 [60];
  String local_1c8;
  undefined1 local_1a9;
  char acStack_1a8 [7];
  bool _kj_shouldLog_1;
  char local_1a0 [8];
  char local_198 [4];
  undefined1 local_194 [60];
  String local_158;
  DebugExpression<char_const(&)[8]> local_140 [8];
  undefined1 local_138 [8];
  DebugComparison<const_char_(&)[8],_kj::String> _kjCondition_1;
  String local_c8;
  undefined1 local_ad;
  bool _kj_shouldLog;
  StringTree local_a0;
  String local_68;
  DebugExpression<char_const(&)[7]> local_50 [8];
  undefined1 local_48 [8];
  DebugComparison<const_char_(&)[7],_kj::String> _kjCondition;
  TestCase29 *this_local;
  
  _kjCondition._48_8_ = this;
  local_50 = (DebugExpression<char_const(&)[7]>  [8])
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,(char (*) [7])0x942b88);
  strTree<char_const(&)[4],char_const(&)[4]>
            (&local_a0,(kj *)0x9422c6,(char (*) [4])0x91cc8d,(char (*) [4])in_RCX);
  StringTree::flatten(&local_68,&local_a0);
  DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_kj::String> *)local_48,local_50,&local_68);
  String::~String(&local_68);
  StringTree::~StringTree(&local_a0);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    local_ad = Debug::shouldLog(ERROR);
    while ((bool)local_ad != false) {
      strTree<char_const(&)[4],char_const(&)[4]>
                ((StringTree *)&_kjCondition_1.result,(kj *)0x9422c6,(char (*) [4])0x91cc8d,
                 (char (*) [4])in_RCX);
      StringTree::flatten(&local_c8,(StringTree *)&_kjCondition_1.result);
      in_RCX = 
      "\"failed: expected \" \"(\\\"foobar\\\") == (strTree(\\\"foo\\\", \\\"bar\\\").flatten())\", _kjCondition, \"foobar\", strTree(\"foo\", \"bar\").flatten()"
      ;
      Debug::
      log<char_const(&)[65],kj::_::DebugComparison<char_const(&)[7],kj::String>&,char_const(&)[7],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x1e,ERROR,
                 "\"failed: expected \" \"(\\\"foobar\\\") == (strTree(\\\"foo\\\", \\\"bar\\\").flatten())\", _kjCondition, \"foobar\", strTree(\"foo\", \"bar\").flatten()"
                 ,(char (*) [65])
                  "failed: expected (\"foobar\") == (strTree(\"foo\", \"bar\").flatten())",
                 (DebugComparison<const_char_(&)[7],_kj::String> *)local_48,(char (*) [7])0x942b88,
                 &local_c8);
      String::~String(&local_c8);
      StringTree::~StringTree((StringTree *)&_kjCondition_1.result);
      local_ad = false;
    }
  }
  DebugComparison<const_char_(&)[7],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[7],_kj::String> *)local_48);
  local_140 = (DebugExpression<char_const(&)[8]>  [8])
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,(char (*) [8])"1 2 3 4");
  local_194._0_4_ = 1;
  local_198[0] = '\x02';
  local_198[1] = '\0';
  local_198[2] = '\0';
  local_198[3] = '\0';
  local_1a0 = (char  [8])0x3;
  _acStack_1a8 = 4;
  pcVar2 = " ";
  strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
            ((StringTree *)(local_194 + 4),(kj *)local_194,(int *)0x96c9f6,(char (*) [2])local_198,
             (uint *)0x96c9f6,(char (*) [2])local_1a0,(long *)0x96c9f6,(char (*) [2])acStack_1a8,
             in_stack_fffffffffffff8c8);
  StringTree::flatten(&local_158,(StringTree *)(local_194 + 4));
  DebugExpression<char_const(&)[8]>::operator==
            ((DebugComparison<const_char_(&)[8],_kj::String> *)local_138,local_140,&local_158);
  String::~String(&local_158);
  StringTree::~StringTree((StringTree *)(local_194 + 4));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    local_1a9 = Debug::shouldLog(ERROR);
    while ((bool)local_1a9 != false) {
      local_204._0_4_ = 1;
      local_208[0] = '\x02';
      local_208[1] = '\0';
      local_208[2] = '\0';
      local_208[3] = '\0';
      local_210 = (char  [8])0x3;
      _kjCondition_2.result = true;
      _kjCondition_2._49_7_ = 0;
      strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
                ((StringTree *)(local_204 + 4),(kj *)local_204,(int *)0x96c9f6,
                 (char (*) [2])local_208,(uint *)0x96c9f6,(char (*) [2])local_210,(long *)0x96c9f6,
                 (char (*) [2])&_kjCondition_2.result,in_stack_fffffffffffff8c8);
      StringTree::flatten(&local_1c8,(StringTree *)(local_204 + 4));
      pcVar2 = "1 2 3 4";
      Debug::
      log<char_const(&)[83],kj::_::DebugComparison<char_const(&)[8],kj::String>&,char_const(&)[8],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x1f,ERROR,
                 "\"failed: expected \" \"(\\\"1 2 3 4\\\") == (strTree(1, \\\" \\\", 2u, \\\" \\\", 3l, \\\" \\\", 4ll).flatten())\", _kjCondition, \"1 2 3 4\", strTree(1, \" \", 2u, \" \", 3l, \" \", 4ll).flatten()"
                 ,(char (*) [83])
                  "failed: expected (\"1 2 3 4\") == (strTree(1, \" \", 2u, \" \", 3l, \" \", 4ll).flatten())"
                 ,(DebugComparison<const_char_(&)[8],_kj::String> *)local_138,
                 (char (*) [8])"1 2 3 4",&local_1c8);
      String::~String(&local_1c8);
      StringTree::~StringTree((StringTree *)(local_204 + 4));
      local_1a9 = false;
    }
  }
  DebugComparison<const_char_(&)[8],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[8],_kj::String> *)local_138);
  local_258 = (DebugExpression<char_const(&)[20]>  [8])
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                         (char (*) [20])"1.5 foo 1e15 bar -3");
  local_2ac._0_4_ = 0x3fc00000;
  _acStack_2b8 = 0x430c6bf526340000;
  local_2bc[0] = -3;
  local_2bc[1] = -1;
  local_2bc[2] = -1;
  local_2bc[3] = -1;
  params_2 = " bar ";
  strTree<float,char_const(&)[6],double,char_const(&)[6],int>
            ((StringTree *)(local_2ac + 4),(kj *)local_2ac,(float *)" foo ",
             (char (*) [6])acStack_2b8,(double *)" bar ",(char (*) [6])local_2bc,(int *)pcVar2);
  StringTree::flatten(&local_270,(StringTree *)(local_2ac + 4));
  DebugExpression<char_const(&)[20]>::operator==
            ((DebugComparison<const_char_(&)[20],_kj::String> *)local_250,local_258,&local_270);
  String::~String(&local_270);
  StringTree::~StringTree((StringTree *)(local_2ac + 4));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_250);
  if (!bVar1) {
    local_2bd = Debug::shouldLog(ERROR);
    while ((bool)local_2bd != false) {
      local_314._0_4_ = 0x3fc00000;
      local_320[0] = '\0';
      local_320[1] = '\0';
      local_320[2] = '4';
      local_320[3] = '&';
      local_320[4] = -0xb;
      local_320[5] = 'k';
      local_320[6] = '\f';
      local_320[7] = 'C';
      _kjCondition_3._52_4_ = 0xfffffffd;
      strTree<float,char_const(&)[6],double,char_const(&)[6],int>
                ((StringTree *)(local_314 + 4),(kj *)local_314,(float *)" foo ",
                 (char (*) [6])local_320,(double *)" bar ",(char (*) [6])&_kjCondition_3.field_0x34,
                 (int *)pcVar2);
      StringTree::flatten(&local_2d8,(StringTree *)(local_314 + 4));
      pcVar2 = "1.5 foo 1e15 bar -3";
      params_2 = 
      "failed: expected (\"1.5 foo 1e15 bar -3\") == (strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten())"
      ;
      Debug::
      log<char_const(&)[98],kj::_::DebugComparison<char_const(&)[20],kj::String>&,char_const(&)[20],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x20,ERROR,
                 "\"failed: expected \" \"(\\\"1.5 foo 1e15 bar -3\\\") == (strTree(1.5f, \\\" foo \\\", 1e15, \\\" bar \\\", -3).flatten())\", _kjCondition, \"1.5 foo 1e15 bar -3\", strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten()"
                 ,(char (*) [98])
                  "failed: expected (\"1.5 foo 1e15 bar -3\") == (strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten())"
                 ,(DebugComparison<const_char_(&)[20],_kj::String> *)local_250,
                 (char (*) [20])"1.5 foo 1e15 bar -3",&local_2d8);
      String::~String(&local_2d8);
      StringTree::~StringTree((StringTree *)(local_314 + 4));
      local_2bd = false;
    }
  }
  DebugComparison<const_char_(&)[20],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[20],_kj::String> *)local_250);
  local_368 = (DebugExpression<char_const(&)[4]>  [8])
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,(char (*) [4])0x9422c6);
  local_3bb[2] = 0x66;
  local_3bb[1] = 0x6f;
  local_3bb[0] = 0x6f;
  pcVar2 = local_3bb;
  strTree<char,char,char>
            ((StringTree *)local_3b8,(kj *)(local_3bb + 2),local_3bb + 1,pcVar2,params_2);
  StringTree::flatten(&local_380,(StringTree *)local_3b8);
  DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_360,local_368,&local_380);
  String::~String(&local_380);
  StringTree::~StringTree((StringTree *)local_3b8);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_360);
  if (!bVar1) {
    local_3bc = Debug::shouldLog(ERROR);
    while ((bool)local_3bc != false) {
      tree.branches.disposer._7_1_ = 0x66;
      tree.branches.disposer._6_1_ = 0x6f;
      tree.branches.disposer._5_1_ = 0x6f;
      strTree<char,char,char>
                (&local_410,(kj *)((long)&tree.branches.disposer + 7),
                 (char *)((long)&tree.branches.disposer + 6),
                 (char *)((long)&tree.branches.disposer + 5),params_2);
      StringTree::flatten(&local_3d8,&local_410);
      pcVar2 = 
      "\"failed: expected \" \"(\\\"foo\\\") == (strTree(\'f\', \'o\', \'o\').flatten())\", _kjCondition, \"foo\", strTree(\'f\', \'o\', \'o\').flatten()"
      ;
      params_2 = "failed: expected (\"foo\") == (strTree(\'f\', \'o\', \'o\').flatten())";
      Debug::
      log<char_const(&)[63],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x21,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (strTree(\'f\', \'o\', \'o\').flatten())\", _kjCondition, \"foo\", strTree(\'f\', \'o\', \'o\').flatten()"
                 ,(char (*) [63])
                  "failed: expected (\"foo\") == (strTree(\'f\', \'o\', \'o\').flatten())",
                 (DebugComparison<const_char_(&)[4],_kj::String> *)local_360,(char (*) [4])0x9422c6,
                 &local_3d8);
      String::~String(&local_3d8);
      StringTree::~StringTree(&local_410);
      local_3bc = false;
    }
  }
  DebugComparison<const_char_(&)[4],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[4],_kj::String> *)local_360);
  str<char_const(&)[4]>((String *)local_4a0,(kj *)0x9422c6,params);
  str<char_const(&)[4]>((String *)&_kjCondition_4.result,(kj *)0x91cc8d,params_00);
  strTree<kj::String,kj::String>
            ((StringTree *)local_488,(kj *)local_4a0,(String *)&_kjCondition_4.result,
             (String *)pcVar2);
  strTree<kj::StringTree,char_const(&)[4]>
            ((StringTree *)(local_488 + 0x38),(kj *)local_488,(StringTree *)0x91ea93,
             (char (*) [4])pcVar2);
  StringTree::~StringTree((StringTree *)local_488);
  String::~String((String *)&_kjCondition_4.result);
  String::~String((String *)local_4a0);
  local_4f8 = (DebugExpression<char_const(&)[10]>  [8])
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,(char (*) [10])0x93abc9);
  StringTree::flatten((String *)local_510,(StringTree *)(local_488 + 0x38));
  DebugExpression<char_const(&)[10]>::operator==
            ((DebugComparison<const_char_(&)[10],_kj::String> *)local_4f0,local_4f8,
             (String *)local_510);
  String::~String((String *)local_510);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_4f0);
  if (!bVar1) {
    local_511 = Debug::shouldLog(ERROR);
    while ((bool)local_511 != false) {
      StringTree::flatten((String *)local_530,(StringTree *)(local_488 + 0x38));
      params_2 = "failed: expected (\"foobarbaz\") == (tree.flatten())";
      Debug::
      log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[10],kj::String>&,char_const(&)[10],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x25,ERROR,
                 "\"failed: expected \" \"(\\\"foobarbaz\\\") == (tree.flatten())\", _kjCondition, \"foobarbaz\", tree.flatten()"
                 ,(char (*) [51])"failed: expected (\"foobarbaz\") == (tree.flatten())",
                 (DebugComparison<const_char_(&)[10],_kj::String> *)local_4f0,
                 (char (*) [10])0x93abc9,(String *)local_530);
      String::~String((String *)local_530);
      local_511 = false;
    }
  }
  DebugComparison<const_char_(&)[10],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[10],_kj::String> *)local_4f0);
  local_534 = 0;
  _kjCondition_5._32_8_ = &local_534;
  StringTree::visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0>
            ((StringTree *)(local_488 + 0x38),(anon_class_8_1_6ec8c47f *)&_kjCondition_5.result);
  local_570 = 3;
  uStack_56c = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_570)
  ;
  DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_568,
             (DebugExpression<unsigned_int> *)&stack0xfffffffffffffa94,&local_534);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_568);
  if (!bVar1) {
    _kjCondition_6._55_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_6._55_1_ != '\0') {
      _kjCondition_6.result = true;
      _kjCondition_6._49_3_ = 0;
      params_2 = "failed: expected (3u) == (pieceCount)";
      Debug::
      log<char_const(&)[38],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x29,ERROR,
                 "\"failed: expected \" \"(3u) == (pieceCount)\", _kjCondition, 3u, pieceCount",
                 (char (*) [38])"failed: expected (3u) == (pieceCount)",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_568,
                 (uint *)&_kjCondition_6.result,&local_534);
      _kjCondition_6._55_1_ = 0;
    }
  }
  StringTree::~StringTree((StringTree *)(local_488 + 0x38));
  local_5b8 = (DebugExpression<char_const(&)[12]>  [8])
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,(char (*) [12])"<foobarbaz>");
  local_5d1[0] = 0x3c;
  str<char_const(&)[4]>((String *)local_628,(kj *)0x9422c6,params_01);
  str<char_const(&)[4]>((String *)(local_641 + 1),(kj *)0x91ea93,params_02);
  strTree<kj::String,char_const(&)[4],kj::String>
            ((StringTree *)(local_628 + 0x18),(kj *)local_628,(String *)0x91cc8d,
             (char (*) [4])(local_641 + 1),(String *)params_2);
  local_641[0] = 0x3e;
  str<char,kj::StringTree,char>
            ((String *)(local_5d1 + 1),(kj *)local_5d1,local_628 + 0x18,(StringTree *)local_641,
             params_2);
  DebugExpression<char_const(&)[12]>::operator==
            ((DebugComparison<const_char_(&)[12],_kj::String> *)local_5b0,local_5b8,
             (String *)(local_5d1 + 1));
  String::~String((String *)(local_5d1 + 1));
  StringTree::~StringTree((StringTree *)(local_628 + 0x18));
  String::~String((String *)(local_641 + 1));
  String::~String((String *)local_628);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_5b0);
  if (!bVar1) {
    local_642 = Debug::shouldLog(ERROR);
    params_03 = extraout_RDX;
    while (local_642 != false) {
      local_661[0] = 0x3c;
      str<char_const(&)[4]>((String *)local_6b8,(kj *)0x9422c6,params_03);
      str<char_const(&)[4]>((String *)(local_6d1 + 1),(kj *)0x91ea93,params_04);
      strTree<kj::String,char_const(&)[4],kj::String>
                ((StringTree *)(local_6b8 + 0x18),(kj *)local_6b8,(String *)0x91cc8d,
                 (char (*) [4])(local_6d1 + 1),(String *)params_2);
      local_6d1[0] = 0x3e;
      str<char,kj::StringTree,char>
                ((String *)(local_661 + 1),(kj *)local_661,local_6b8 + 0x18,(StringTree *)local_6d1,
                 params_2);
      params_2 = 
      "failed: expected (\"<foobarbaz>\") == (str(\'<\', strTree(str(\"foo\"), \"bar\", str(\"baz\")), \'>\'))"
      ;
      Debug::
      log<char_const(&)[92],kj::_::DebugComparison<char_const(&)[12],kj::String>&,char_const(&)[12],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x2c,ERROR,
                 "\"failed: expected \" \"(\\\"<foobarbaz>\\\") == (str(\'<\', strTree(str(\\\"foo\\\"), \\\"bar\\\", str(\\\"baz\\\")), \'>\'))\", _kjCondition, \"<foobarbaz>\", str(\'<\', strTree(str(\"foo\"), \"bar\", str(\"baz\")), \'>\')"
                 ,(char (*) [92])
                  "failed: expected (\"<foobarbaz>\") == (str(\'<\', strTree(str(\"foo\"), \"bar\", str(\"baz\")), \'>\'))"
                 ,(DebugComparison<const_char_(&)[12],_kj::String> *)local_5b0,
                 (char (*) [12])"<foobarbaz>",(String *)(local_661 + 1));
      String::~String((String *)(local_661 + 1));
      StringTree::~StringTree((StringTree *)(local_6b8 + 0x18));
      String::~String((String *)(local_6d1 + 1));
      String::~String((String *)local_6b8);
      params_03 = extraout_RDX_00;
      local_642 = false;
    }
  }
  DebugComparison<const_char_(&)[12],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[12],_kj::String> *)local_5b0);
  return;
}

Assistant:

TEST(StringTree, StrTree) {
  EXPECT_EQ("foobar", strTree("foo", "bar").flatten());
  EXPECT_EQ("1 2 3 4", strTree(1, " ", 2u, " ", 3l, " ", 4ll).flatten());
  EXPECT_EQ("1.5 foo 1e15 bar -3", strTree(1.5f, " foo ", 1e15, " bar ", -3).flatten());
  EXPECT_EQ("foo", strTree('f', 'o', 'o').flatten());

  {
    StringTree tree = strTree(strTree(str("foo"), str("bar")), "baz");
    EXPECT_EQ("foobarbaz", tree.flatten());

    uint pieceCount = 0;
    tree.visit([&](ArrayPtr<const char> part) { ++pieceCount; EXPECT_EQ(3u, part.size()); });
    EXPECT_EQ(3u, pieceCount);
  }

  EXPECT_EQ("<foobarbaz>", str('<', strTree(str("foo"), "bar", str("baz")), '>'));
}